

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_daemon.c
# Opt level: O0

int check_pid(char *pidfile)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  int n;
  FILE *f;
  char *pcStack_18;
  int pid;
  char *pidfile_local;
  
  f._4_4_ = 0;
  pcStack_18 = pidfile;
  __stream = fopen(pidfile,"r");
  if (__stream != (FILE *)0x0) {
    iVar1 = __isoc99_fscanf(__stream,"%d",(long)&f + 4);
    fclose(__stream);
    iVar3 = f._4_4_;
    if (((iVar1 == 1) && (f._4_4_ != 0)) && (_Var2 = getpid(), iVar3 != _Var2)) {
      iVar3 = kill(f._4_4_,0);
      if ((iVar3 != 0) && (piVar4 = __errno_location(), *piVar4 == 3)) {
        return 0;
      }
      return f._4_4_;
    }
  }
  return 0;
}

Assistant:

static int
check_pid(const char *pidfile) {
	int pid = 0;
	FILE *f = fopen(pidfile,"r");
	if (f == NULL)
		return 0;
	int n = fscanf(f,"%d", &pid);
	fclose(f);

	if (n !=1 || pid == 0 || pid == getpid()) {
		return 0;
	}

	if (kill(pid, 0) && errno == ESRCH)
		return 0;

	return pid;
}